

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
FactoredDecPOMDPDiscrete::SetScopeForLRF
          (FactoredDecPOMDPDiscrete *this,Index LRF,Scope *X,Scope *A,Scope *Y,Scope *O)

{
  Scope Abackedup;
  Scope Xbackedup;
  Scope local_60;
  Scope local_48;
  
  (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                         super_MultiAgentDecisionProcess + 0x1b0))(&local_48,this,Y,O);
  (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                         super_MultiAgentDecisionProcess + 0x1b8))(&local_60,this,Y,O);
  Scope::Insert(&local_48,X);
  Scope::Sort(&local_48);
  Scope::Insert(&local_60,A);
  Scope::Sort(&local_60);
  SetScopeForLRF(this,LRF,&local_48,&local_60);
  if (local_60.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.super_SDT.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super_SDT.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super_SDT.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FactoredDecPOMDPDiscrete::SetScopeForLRF(Index LRF, 
            const Scope& X, //the X scope
            const Scope& A, //the A scope
            const Scope& Y,
            const Scope& O
        )
{
    Scope Xbackedup = StateScopeBackup( Y, O);
    Scope Abackedup = AgentScopeBackup( Y, O);
    // X'' = X' + X
    Xbackedup.Insert(X);
    Xbackedup.Sort();
    // A'' = A' + A
    Abackedup.Insert(A);
    Abackedup.Sort();
    SetScopeForLRF(LRF, Xbackedup, Abackedup);
}